

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::DtlsSession::TryWrite(Error *__return_storage_ptr__,DtlsSession *this)

{
  ErrorCode EVar1;
  _Elt_pointer aBuf;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  while( true ) {
    aBuf = (this->mSendQueue).c.
           super__Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->mSendQueue).c.
        super__Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == aBuf) {
      return __return_storage_ptr__;
    }
    Write((Error *)local_58,this,&aBuf->first,aBuf->second);
    __return_storage_ptr__->mCode = local_58._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50)
    ;
    EVar1 = __return_storage_ptr__->mCode;
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    if (EVar1 != kNone) break;
    std::
    deque<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
    ::pop_front(&(this->mSendQueue).c);
    if (__return_storage_ptr__->mCode != kNone) {
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::TryWrite()
{
    Error error;
    while (error == ErrorCode::kNone && !mSendQueue.empty())
    {
        auto &messagePair = mSendQueue.front();

        SuccessOrExit(error = Write(messagePair.first, messagePair.second));
        mSendQueue.pop();
    }

exit:
    return error;
}